

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteBook.c
# Opt level: O0

void Io_NtkWriteNets(FILE *pFile,Abc_Ntk_t *pNtk)

{
  FILE *pFile_00;
  int iVar1;
  int iVar2;
  uint uVar3;
  Abc_Obj_t *pAVar4;
  ProgressBar *p;
  int local_30;
  uint local_2c;
  int i;
  uint numPin;
  Abc_Obj_t *pNet;
  ProgressBar *pProgress;
  Abc_Ntk_t *pNtk_local;
  FILE *pFile_local;
  
  local_2c = 0;
  iVar1 = Abc_NtkIsNetlist(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioWriteBook.c"
                  ,0x19a,"void Io_NtkWriteNets(FILE *, Abc_Ntk_t *)");
  }
  for (local_30 = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_30 < iVar1; local_30 = local_30 + 1) {
    pAVar4 = Abc_NtkObj(pNtk,local_30);
    if ((pAVar4 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNet(pAVar4), iVar1 != 0)) {
      iVar1 = Abc_ObjFaninNum(pAVar4);
      iVar2 = Abc_ObjFanoutNum(pAVar4);
      local_2c = iVar1 + iVar2 + local_2c;
    }
  }
  uVar3 = Abc_NtkNetNum(pNtk);
  printf("NumNets  : %d\t",(ulong)uVar3);
  printf("NumPins      : %d\n\n",(ulong)local_2c);
  fprintf((FILE *)pFile,"UCLA    nets    1.0\n");
  uVar3 = Abc_NtkNetNum(pNtk);
  fprintf((FILE *)pFile,"NumNets : %d\n",(ulong)uVar3);
  fprintf((FILE *)pFile,"NumPins : %d\n",(ulong)local_2c);
  pFile_00 = _stdout;
  iVar1 = Abc_NtkNetNum(pNtk);
  p = Extra_ProgressBarStart(pFile_00,iVar1);
  for (local_30 = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_30 < iVar1; local_30 = local_30 + 1) {
    pAVar4 = Abc_NtkObj(pNtk,local_30);
    if ((pAVar4 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNet(pAVar4), iVar1 != 0)) {
      Extra_ProgressBarUpdate(p,local_30,(char *)0x0);
      Io_NtkWriteIntNet(pFile,pAVar4);
    }
  }
  Extra_ProgressBarStop(p);
  return;
}

Assistant:

void Io_NtkWriteNets( FILE * pFile, Abc_Ntk_t * pNtk )
{
    ProgressBar * pProgress;
    Abc_Obj_t * pNet;
    unsigned numPin=0;
    int i;

    assert( Abc_NtkIsNetlist(pNtk) );
    // write the head
    Abc_NtkForEachNet( pNtk, pNet, i )
    numPin+=Abc_ObjFaninNum(pNet)+Abc_ObjFanoutNum(pNet);
    printf( "NumNets  : %d\t", Abc_NtkNetNum(pNtk) );
    printf( "NumPins      : %d\n\n", numPin );
    fprintf( pFile, "UCLA    nets    1.0\n");
    fprintf( pFile, "NumNets : %d\n", Abc_NtkNetNum(pNtk) );
    fprintf( pFile, "NumPins : %d\n", numPin );

    // write nets
    pProgress = Extra_ProgressBarStart( stdout, Abc_NtkNetNum(pNtk) );
    Abc_NtkForEachNet( pNtk, pNet, i )
    {
        Extra_ProgressBarUpdate( pProgress, i, NULL );
        Io_NtkWriteIntNet( pFile, pNet );
    }
    Extra_ProgressBarStop( pProgress );
}